

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool ModulusSignedCaseHelper<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::SignedCase(SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  rhs,SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *result)

{
  long lVar1;
  int *in_RSI;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  lVar1 = ::SafeInt::operator_cast_to_long
                    ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (lVar1 == -1) {
    SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              (in_RDI,in_RSI);
  }
  return lVar1 == -1;
}

Assistant:

static bool SignedCase( SafeInt< T, E > rhs, SafeInt< T, E >& result ) SAFEINT_NOTHROW
    {
        if( (T)rhs == (T)-1 )
        {
            result = 0;
            return true;
        }
        return false;
    }